

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

void crnlib::vector<crnlib::image_utils::error_metrics>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  error_metrics *pSrc;
  
  for (lVar6 = 0; (ulong)num * 0x28 - lVar6 != 0; lVar6 = lVar6 + 0x28) {
    puVar1 = (undefined8 *)((long)pSrc_void + lVar6);
    puVar2 = (undefined8 *)((long)pDst_void + lVar6);
    puVar2[4] = puVar1[4];
    uVar3 = *puVar1;
    uVar4 = puVar1[1];
    uVar5 = puVar1[3];
    puVar2[2] = puVar1[2];
    puVar2[3] = uVar5;
    *puVar2 = uVar3;
    puVar2[1] = uVar4;
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num) {
    T* pSrc = static_cast<T*>(pSrc_void);
    T* const pSrc_end = pSrc + num;
    T* pDst = static_cast<T*>(pDst_void);

    while (pSrc != pSrc_end) {
      // placement new
      new (static_cast<void*>(pDst)) T(*pSrc);
      pSrc->~T();
      ++pSrc;
      ++pDst;
    }
  }